

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.hxx
# Opt level: O2

XMLNodeAdapter *
FileParse::operator<<
          (XMLNodeAdapter *node,
          Child<const_std::vector<BSDFData::AngleBasisBlock,_std::allocator<BSDFData::AngleBasisBlock>_>_>
          *vec)

{
  pointer pbVar1;
  pointer pAVar2;
  pointer angleBasisBlock;
  string_view name;
  XMLNodeAdapter secondToLastNode;
  XMLNodeAdapter lastNode;
  XMLNodeAdapter local_60;
  XMLNodeAdapter local_48;
  
  if (((vec->nodeNames).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       (vec->nodeNames).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     ((vec->data->
      super__Vector_base<BSDFData::AngleBasisBlock,_std::allocator<BSDFData::AngleBasisBlock>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (vec->data->
      super__Vector_base<BSDFData::AngleBasisBlock,_std::allocator<BSDFData::AngleBasisBlock>_>).
      _M_impl.super__Vector_impl_data._M_finish)) {
    insertAllButLastChild<XMLNodeAdapter>(&local_60,node,&vec->nodeNames);
    pbVar1 = (vec->nodeNames).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pAVar2 = (vec->data->
             super__Vector_base<BSDFData::AngleBasisBlock,_std::allocator<BSDFData::AngleBasisBlock>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (angleBasisBlock =
              (vec->data->
              super__Vector_base<BSDFData::AngleBasisBlock,_std::allocator<BSDFData::AngleBasisBlock>_>
              )._M_impl.super__Vector_impl_data._M_start; angleBasisBlock != pAVar2;
        angleBasisBlock = angleBasisBlock + 1) {
      name._M_str = pbVar1[-1]._M_dataplus._M_p;
      name._M_len = pbVar1[-1]._M_string_length;
      XMLNodeAdapter::addChild(&local_48,&local_60,name);
      BSDFData::operator<<(&local_48,angleBasisBlock);
      XMLNodeAdapter::~XMLNodeAdapter(&local_48);
    }
    XMLNodeAdapter::~XMLNodeAdapter(&local_60);
  }
  return node;
}

Assistant:

inline NodeAdapter & operator<<(NodeAdapter & node, const Child<const std::vector<T>> & vec)
    {
        if(vec.nodeNames.empty() || vec.data.empty())
            return node;

        auto secondToLastNode{insertAllButLastChild(node, vec.nodeNames)};

        const auto & lastNodeName = vec.nodeNames.back();

        for(const auto & item : vec.data)
        {
            NodeAdapter lastNode = secondToLastNode.addChild(lastNodeName);
            lastNode << item;
        }

        return node;
    }